

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::MapReferencedPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint referencedPropertyIdCount_00;
  anon_class_8_1_13edd398_for_fn fn;
  uint referencedPropertyIdCount;
  FunctionBody *functionBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  fn.functionBody = FuncInfo::GetParsedFunctionBody(funcInfo);
  referencedPropertyIdCount_00 = FuncInfo::GetReferencedPropertyIdCount(funcInfo);
  Js::FunctionBody::CreateReferencedPropertyIdMap(fn.functionBody,referencedPropertyIdCount_00);
  JsUtil::
  BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::Map<ByteCodeGenerator::MapReferencedPropertyIds(FuncInfo*)::__0>
            ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)funcInfo->referencedPropertyIdToMapIndex,fn);
  Js::FunctionBody::VerifyReferencedPropertyIdMap(fn.functionBody);
  return;
}

Assistant:

void ByteCodeGenerator::MapReferencedPropertyIds(FuncInfo * funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint referencedPropertyIdCount = funcInfo->GetReferencedPropertyIdCount();
    functionBody->CreateReferencedPropertyIdMap(referencedPropertyIdCount);

    funcInfo->referencedPropertyIdToMapIndex->Map([functionBody](Js::PropertyId propertyId, uint mapIndex)
    {
        functionBody->SetReferencedPropertyIdWithMapIndex(mapIndex, propertyId);
    });

#if DBG
    functionBody->VerifyReferencedPropertyIdMap();
#endif
}